

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateBufferVariableArraySizeSubCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               ProgramResourcePropFlags targetProp,bool sizedArray,bool extendedCases)

{
  TestNode *pTVar1;
  bool includeBaseCase;
  undefined7 in_register_00000089;
  int expandLevel;
  ProgramResourceQueryTestTarget queryTarget;
  ProgramResourceQueryTestTarget local_38;
  
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_38,PROGRAMINTERFACE_BUFFER_VARIABLE,targetProp);
  if ((int)CONCAT71(in_register_00000089,extendedCases) != 0) {
    pTVar1 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar1,context->m_testCtx,"types","Types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar1);
    generateVariableCases
              (context,parentStructure,(TestCaseGroup *)pTVar1,&local_38,sizedArray + 1,false);
    if (extendedCases) {
      pTVar1 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar1,context->m_testCtx,"aggregates","Aggregate types");
      tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar1);
      targetGroup = (TestCaseGroup *)pTVar1;
    }
  }
  expandLevel = (sizedArray && extendedCases) + 1;
  includeBaseCase = !extendedCases;
  generateBufferBackedArrayStrideTypeAggregateCases
            (context,parentStructure,targetGroup,local_38.interface,TYPE_FLOAT,expandLevel,
             includeBaseCase);
  generateBufferBackedArrayStrideTypeAggregateCases
            (context,parentStructure,targetGroup,local_38.interface,TYPE_BOOL,
             (uint)(sizedArray && extendedCases),includeBaseCase);
  generateBufferBackedArrayStrideTypeAggregateCases
            (context,parentStructure,targetGroup,local_38.interface,TYPE_BOOL_VEC3,expandLevel,
             includeBaseCase);
  generateBufferBackedArrayStrideTypeAggregateCases
            (context,parentStructure,targetGroup,local_38.interface,TYPE_FLOAT_VEC4,expandLevel,
             includeBaseCase);
  generateBufferBackedArrayStrideTypeAggregateCases
            (context,parentStructure,targetGroup,local_38.interface,TYPE_INT_VEC2,expandLevel,
             includeBaseCase);
  return;
}

Assistant:

static void generateBufferVariableArraySizeSubCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, ProgramResourcePropFlags targetProp, bool sizedArray, bool extendedCases)
{
	const ProgramResourceQueryTestTarget	queryTarget		(PROGRAMINTERFACE_BUFFER_VARIABLE, targetProp);
	tcu::TestCaseGroup*						aggregateGroup;

	// .types
	if (extendedCases)
	{
		tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "types", "Types");
		targetGroup->addChild(blockGroup);

		generateVariableCases(context, parentStructure, blockGroup, queryTarget, (sizedArray) ? (2) : (1), false);
	}

	// .aggregates
	if (extendedCases)
	{
		aggregateGroup = new tcu::TestCaseGroup(context.getTestContext(), "aggregates", "Aggregate types");
		targetGroup->addChild(aggregateGroup);
	}
	else
		aggregateGroup = targetGroup;

	// .float_*
	generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, aggregateGroup, queryTarget.interface, glu::TYPE_FLOAT, (extendedCases && sizedArray) ? (2) : (1), !extendedCases);

	// .bool_*
	generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, aggregateGroup, queryTarget.interface, glu::TYPE_BOOL, (extendedCases && sizedArray) ? (1) : (0), !extendedCases);

	// .bvec3_*
	generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, aggregateGroup, queryTarget.interface, glu::TYPE_BOOL_VEC3, (extendedCases && sizedArray) ? (2) : (1), !extendedCases);

	// .vec4_*
	generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, aggregateGroup, queryTarget.interface, glu::TYPE_FLOAT_VEC4, (extendedCases && sizedArray) ? (2) : (1), !extendedCases);

	// .ivec2_*
	generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, aggregateGroup, queryTarget.interface, glu::TYPE_INT_VEC2, (extendedCases && sizedArray) ? (2) : (1), !extendedCases);
}